

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall
wabt::BlockExprBase<(wabt::ExprType)26>::~BlockExprBase(BlockExprBase<(wabt::ExprType)26> *this)

{
  (this->super_ExprMixin<(wabt::ExprType)26>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__BlockExprBase_001b23c8;
  Block::~Block(&this->block);
  return;
}

Assistant:

explicit BlockExprBase(const Location& loc = Location())
      : ExprMixin<TypeEnum>(loc) {}